

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall
Imf_3_4::Header::Header
          (Header *this,int width,int height,float pixelAspectRatio,V2f *screenWindowCenter,
          float screenWindowWidth,LineOrder lineOrder,Compression compression)

{
  int in_EDX;
  int in_ESI;
  Box<Imath_3_2::Vec2<int>_> *in_RDI;
  Box2i displayWindow;
  Compression in_stack_00000254;
  LineOrder in_stack_00000258;
  float in_stack_0000025c;
  V2f *in_stack_00000260;
  float in_stack_0000026c;
  Box2i *in_stack_00000270;
  Box2i *in_stack_00000278;
  Header *in_stack_00000280;
  Vec2<int> *this_00;
  Box<Imath_3_2::Vec2<int>_> *this_01;
  Vec2<int> local_5c;
  Vec2<int> local_54;
  Vec2<int> local_4c [7];
  int local_10;
  int local_c;
  
  in_RDI[2].min.x = 0;
  in_RDI[2].min.y = 0;
  in_RDI[2].max.x = 0;
  in_RDI[2].max.y = 0;
  in_RDI[1].min.x = 0;
  in_RDI[1].min.y = 0;
  in_RDI[1].max.x = 0;
  in_RDI[1].max.y = 0;
  (in_RDI->min).x = 0;
  (in_RDI->min).y = 0;
  (in_RDI->max).x = 0;
  (in_RDI->max).y = 0;
  this_01 = in_RDI;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
  ::map((map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
         *)0x1d5f5a);
  *(undefined1 *)&in_RDI[3].min.x = 0;
  anon_unknown_1::sanityCheckDisplayWindow((int)((ulong)this_01 >> 0x20),(int)this_01);
  staticInitialize();
  Imath_3_2::Vec2<int>::Vec2(&local_54,0,0);
  this_00 = &local_5c;
  Imath_3_2::Vec2<int>::Vec2(this_00,local_c + -1,local_10 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(this_01,local_4c,this_00);
  anon_unknown_1::initialize
            (in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_0000026c,
             in_stack_00000260,in_stack_0000025c,in_stack_00000258,in_stack_00000254);
  return;
}

Assistant:

Header::Header (
    int         width,
    int         height,
    float       pixelAspectRatio,
    const V2f&  screenWindowCenter,
    float       screenWindowWidth,
    LineOrder   lineOrder,
    Compression compression)
    : _map (), _readsNothing (false)
{
    sanityCheckDisplayWindow (width, height);

    staticInitialize ();

    Box2i displayWindow (V2i (0, 0), V2i (width - 1, height - 1));

    initialize (
        *this,
        displayWindow,
        displayWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);
}